

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS
ref_recon_extrapolate_zeroth(REF_GRID ref_grid,REF_DBL *recon,REF_BOOL *replace,REF_INT ldim)

{
  uint uVar1;
  long lVar2;
  REF_INT local_94;
  REF_INT local_90;
  int local_8c;
  REF_INT local_88;
  REF_INT local_84;
  int local_80;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT remain;
  REF_INT pass;
  REF_INT nint;
  REF_INT neighbor;
  REF_INT i;
  REF_EDGE ref_edge;
  int local_40;
  REF_INT edge;
  REF_INT item;
  REF_INT node;
  REF_NODE ref_node;
  REF_BOOL *pRStack_28;
  REF_INT ldim_local;
  REF_BOOL *replace_local;
  REF_DBL *recon_local;
  REF_GRID ref_grid_local;
  
  _item = ref_grid->node;
  ref_node._4_4_ = ldim;
  pRStack_28 = replace;
  replace_local = (REF_BOOL *)recon;
  recon_local = (REF_DBL *)ref_grid;
  uVar1 = ref_edge_create((REF_EDGE *)&neighbor,ref_grid);
  if (uVar1 == 0) {
    uVar1 = ref_node_ghost_int(_item,pRStack_28,ref_node._4_4_);
    if (uVar1 == 0) {
      uVar1 = ref_node_ghost_dbl(_item,(REF_DBL *)replace_local,ref_node._4_4_);
      if (uVar1 == 0) {
        ref_private_macro_code_rss_1 = 1;
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 10;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          for (edge = 0; edge < _item->max; edge = edge + 1) {
            if ((((-1 < edge) && (edge < _item->max)) && (-1 < _item->global[edge])) &&
               (_item->ref_mpi->id == _item->part[edge])) {
              for (nint = 0; nint < ref_node._4_4_; nint = nint + 1) {
                if (pRStack_28[nint + ref_node._4_4_ * edge] != 0) {
                  remain = 0;
                  if ((edge < 0) || (_neighbor->adj->nnode <= edge)) {
                    local_80 = -1;
                  }
                  else {
                    local_80 = _neighbor->adj->first[edge];
                  }
                  local_40 = local_80;
                  if (local_80 == -1) {
                    local_84 = -1;
                  }
                  else {
                    local_84 = _neighbor->adj->item[local_80].ref;
                  }
                  ref_edge._4_4_ = local_84;
                  while (local_40 != -1) {
                    pass = (_neighbor->e2n[ref_edge._4_4_ << 1] +
                           _neighbor->e2n[ref_edge._4_4_ * 2 + 1]) - edge;
                    if (pRStack_28[nint + ref_node._4_4_ * pass] == 0) {
                      remain = remain + 1;
                    }
                    local_40 = _neighbor->adj->item[local_40].next;
                    if (local_40 == -1) {
                      local_88 = -1;
                    }
                    else {
                      local_88 = _neighbor->adj->item[local_40].ref;
                    }
                    ref_edge._4_4_ = local_88;
                  }
                  if (0 < remain) {
                    (replace_local + (long)(nint + ref_node._4_4_ * edge) * 2)[0] = 0;
                    (replace_local + (long)(nint + ref_node._4_4_ * edge) * 2)[1] = 0;
                    if ((edge < 0) || (_neighbor->adj->nnode <= edge)) {
                      local_8c = -1;
                    }
                    else {
                      local_8c = _neighbor->adj->first[edge];
                    }
                    local_40 = local_8c;
                    if (local_8c == -1) {
                      local_90 = -1;
                    }
                    else {
                      local_90 = _neighbor->adj->item[local_8c].ref;
                    }
                    ref_edge._4_4_ = local_90;
                    while (local_40 != -1) {
                      pass = (_neighbor->e2n[ref_edge._4_4_ << 1] +
                             _neighbor->e2n[ref_edge._4_4_ * 2 + 1]) - edge;
                      if (pRStack_28[nint + ref_node._4_4_ * pass] == 0) {
                        lVar2 = (long)(nint + ref_node._4_4_ * edge);
                        *(double *)(replace_local + lVar2 * 2) =
                             *(double *)(replace_local + (long)(nint + ref_node._4_4_ * pass) * 2) +
                             *(double *)(replace_local + lVar2 * 2);
                      }
                      local_40 = _neighbor->adj->item[local_40].next;
                      if (local_40 == -1) {
                        local_94 = -1;
                      }
                      else {
                        local_94 = _neighbor->adj->item[local_40].ref;
                      }
                      ref_edge._4_4_ = local_94;
                    }
                    lVar2 = (long)(nint + ref_node._4_4_ * edge);
                    *(double *)(replace_local + lVar2 * 2) =
                         *(double *)(replace_local + lVar2 * 2) / (double)remain;
                    pRStack_28[nint + ref_node._4_4_ * edge] = 0;
                  }
                }
              }
            }
          }
          uVar1 = ref_node_ghost_int(_item,pRStack_28,ref_node._4_4_);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x462,"ref_recon_extrapolate_zeroth",(ulong)uVar1,"update ghosts");
            return uVar1;
          }
          uVar1 = ref_node_ghost_dbl(_item,(REF_DBL *)replace_local,ref_node._4_4_);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x463,"ref_recon_extrapolate_zeroth",(ulong)uVar1,"update ghosts");
            return uVar1;
          }
          ref_private_macro_code_rss_1 = 0;
          for (edge = 0; edge < _item->max; edge = edge + 1) {
            if ((((-1 < edge) && (edge < _item->max)) && (-1 < _item->global[edge])) &&
               (_item->ref_mpi->id == _item->part[edge])) {
              for (nint = 0; nint < ref_node._4_4_; nint = nint + 1) {
                if (pRStack_28[nint + ref_node._4_4_ * edge] != 0) {
                  ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
                }
              }
            }
          }
          uVar1 = ref_mpi_allsum((REF_MPI)*recon_local,&ref_private_macro_code_rss_1,1,1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x46d,"ref_recon_extrapolate_zeroth",(ulong)uVar1,"sum updates");
            return uVar1;
          }
          if (ref_private_macro_code_rss_1 == 0) break;
        }
        ref_edge_free(_neighbor);
        if ((0 < ref_private_macro_code_rss_1) && (*(int *)((long)*recon_local + 4) == 0)) {
          printf(" %d remain\n",(ulong)(uint)ref_private_macro_code_rss_1);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x476,"ref_recon_extrapolate_zeroth","untouched boundary nodes remain");
        }
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x442,"ref_recon_extrapolate_zeroth",(ulong)uVar1,"update ghosts");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x441
             ,"ref_recon_extrapolate_zeroth",(ulong)uVar1,"update ghosts");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x43f,
           "ref_recon_extrapolate_zeroth",(ulong)uVar1,"edges");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_recon_extrapolate_zeroth(REF_GRID ref_grid,
                                                REF_DBL *recon,
                                                REF_BOOL *replace,
                                                REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, item, edge;
  REF_EDGE ref_edge;
  REF_INT i, neighbor, nint;
  REF_INT pass, remain;

  RSS(ref_edge_create(&ref_edge, ref_grid), "edges");

  RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
  RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");

  remain = 1;
  for (pass = 0; pass < 10; pass++) {
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node)) {
        for (i = 0; i < ldim; i++) {
          if (replace[i + ldim * node]) {
            nint = 0;
            each_edge_having_node(ref_edge, node, item, edge) {
              neighbor = ref_edge_e2n(ref_edge, 0, edge) +
                         ref_edge_e2n(ref_edge, 1, edge) - node;
              if (!replace[i + ldim * neighbor]) nint++;
            }
            if (0 < nint) {
              recon[i + ldim * node] = 0.0;
              each_edge_having_node(ref_edge, node, item, edge) {
                neighbor = ref_edge_e2n(ref_edge, 0, edge) +
                           ref_edge_e2n(ref_edge, 1, edge) - node;
                if (!replace[i + ldim * neighbor]) {
                  recon[i + ldim * node] += recon[i + ldim * neighbor];
                }
              }
              /* use Euclidean average, these are derivatives */
              recon[i + ldim * node] /= (REF_DBL)nint;
              replace[i + ldim * node] = REF_FALSE;
            }
          }
        }
      }
    }

    RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
    RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");
    remain = 0;
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node)) {
        for (i = 0; i < ldim; i++) {
          if (replace[i + ldim * node]) remain++;
        }
      }
    }
    RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), &remain, 1, REF_INT_TYPE),
        "sum updates");

    if (0 == remain) break;
  }

  ref_edge_free(ref_edge);

  if (0 < remain && ref_mpi_once(ref_grid_mpi(ref_grid))) {
    printf(" %d remain\n", remain);
    REF_WHERE("untouched boundary nodes remain");
  }

  return REF_SUCCESS;
}